

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O0

void gmlc::utilities::stringOps::splitline
               (string_view line,stringVector *strVec,string_view delimiters,
               delimiter_compression compression)

{
  undefined4 in_R9D;
  bool in_stack_0000009f;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_000000a0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_000000a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  
  generalized_string_split<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
            (in_stack_000000a8,in_stack_000000a0,in_stack_0000009f);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0));
  return;
}

Assistant:

void splitline(
        std::string_view line,
        stringVector& strVec,
        std::string_view delimiters,
        delimiter_compression compression)
    {
        strVec = generalized_string_split<std::string_view, std::string>(
            line, delimiters, (compression == delimiter_compression::on));
    }